

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

Roaring64Map *
roaring::Roaring64Map::fastunion
          (Roaring64Map *__return_storage_ptr__,size_t n,Roaring64Map **inputs)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  roaring_bitmap_t *__ptr;
  size_t sVar7;
  anon_class_1_0_00000001 pq_comp;
  Roaring64Map *result;
  vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
  group_bitmaps;
  priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
  pq;
  anon_class_1_0_00000001 local_e1;
  Roaring64Map *local_e0;
  roaring_bitmap_s **local_d8;
  iterator iStack_d0;
  roaring_bitmap_s **local_c8;
  priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
  local_b8;
  undefined1 local_98 [8];
  const_iterator cStack_90;
  pointer local_88;
  uint16_t *local_80;
  uint8_t *puStack_78;
  uint8_t local_70;
  undefined7 uStack_6f;
  const_iterator local_60;
  _Base_ptr local_58;
  pointer ppStack_50;
  uint16_t *local_48;
  uint8_t *puStack_40;
  uint8_t local_38;
  undefined7 uStack_37;
  
  local_98 = (undefined1  [8])0x0;
  cStack_90._M_node = (_Base_ptr)0x0;
  local_88 = (pointer)0x0;
  local_e0 = __return_storage_ptr__;
  std::
  priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
  ::priority_queue(&local_b8,&local_e1,(vector<pq_entry,_std::allocator<pq_entry>_> *)local_98);
  if (local_98 != (undefined1  [8])0x0) {
    operator_delete((void *)local_98);
  }
  if (n != 0) {
    sVar7 = 0;
    do {
      p_Var3 = (inputs[sVar7]->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 = &(inputs[sVar7]->roarings)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var3 != p_Var5) {
        local_98 = (undefined1  [8])p_Var3;
        cStack_90._M_node = &p_Var5->_M_header;
        std::
        priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
        ::push(&local_b8,(value_type *)local_98);
      }
      sVar7 = sVar7 + 1;
    } while (n != sVar7);
  }
  local_d8 = (roaring_bitmap_s **)0x0;
  iStack_d0._M_current = (roaring_bitmap_s **)0x0;
  local_c8 = (roaring_bitmap_s **)0x0;
  local_60._M_node = &(local_e0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header;
  (local_e0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (local_e0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (local_e0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (local_e0->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(local_e0->roarings)._M_t._M_impl = 0;
  *(undefined8 *)&(local_e0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (local_e0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_60._M_node;
  (local_e0->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_60._M_node;
  (local_e0->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0->copyOnWrite = false;
  if (local_b8.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b8.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (iStack_d0._M_current != local_d8) {
        iStack_d0._M_current = local_d8;
      }
      _Var1 = ((local_b8.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
                super__Vector_impl_data._M_start)->iterator)._M_node[1]._M_color;
      do {
        if (local_b8.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_b8.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        p_Var4 = ((local_b8.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
                   super__Vector_impl_data._M_start)->iterator)._M_node;
        _Var2 = p_Var4[1]._M_color;
        if (_Var2 != _Var1) break;
        p_Var3 = ((local_b8.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
                   super__Vector_impl_data._M_start)->end)._M_node;
        local_98 = (undefined1  [8])&p_Var4[1]._M_parent;
        if (iStack_d0._M_current == local_c8) {
          std::
          vector<roaring::api::roaring_bitmap_s_const*,std::allocator<roaring::api::roaring_bitmap_s_const*>>
          ::_M_realloc_insert<roaring::api::roaring_bitmap_s_const*>
                    ((vector<roaring::api::roaring_bitmap_s_const*,std::allocator<roaring::api::roaring_bitmap_s_const*>>
                      *)&local_d8,iStack_d0,(roaring_bitmap_s **)local_98);
        }
        else {
          *iStack_d0._M_current = (roaring_bitmap_s *)local_98;
          iStack_d0._M_current = iStack_d0._M_current + 1;
        }
        std::
        priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
        ::pop(&local_b8);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        if (p_Var6 != p_Var3) {
          local_98 = (undefined1  [8])p_Var6;
          cStack_90._M_node = p_Var3;
          std::
          priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
          ::push(&local_b8,(value_type *)local_98);
        }
      } while (_Var2 == _Var1);
      __ptr = roaring_bitmap_or_many
                        ((long)iStack_d0._M_current - (long)local_d8 >> 3,
                         (roaring_bitmap_t **)local_d8);
      local_38 = (__ptr->high_low_container).flags;
      uStack_37 = *(undefined7 *)&(__ptr->high_low_container).field_0x21;
      local_58 = *(_Base_ptr *)&__ptr->high_low_container;
      ppStack_50 = (pointer)(__ptr->high_low_container).containers;
      local_48 = (__ptr->high_low_container).keys;
      puStack_40 = (__ptr->high_low_container).typecodes;
      roaring_free(__ptr);
      local_98._0_4_ = _Var1;
      local_70 = local_38;
      uStack_6f = uStack_37;
      local_80 = local_48;
      puStack_78 = puStack_40;
      cStack_90._M_node = local_58;
      local_88 = ppStack_50;
      roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_58,0);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
      ::_M_emplace_hint_unique<std::pair<unsigned_int,roaring::Roaring>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
                  *)local_e0,local_60,(pair<unsigned_int,_roaring::Roaring> *)local_98);
      Roaring::~Roaring((Roaring *)&cStack_90);
      Roaring::~Roaring((Roaring *)&local_58);
    } while (local_b8.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_b8.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_d8 != (roaring_bitmap_s **)0x0) {
    operator_delete(local_d8);
  }
  if (local_b8.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.c.super__Vector_base<pq_entry,_std::allocator<pq_entry>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_e0;
}

Assistant:

static Roaring64Map fastunion(size_t n, const Roaring64Map **inputs) {
        // The strategy here is to basically do a "group by" operation.
        // We group the input roarings by key, do a 32-bit
        // roaring_bitmap_or_many on each group, and collect the results.
        // We accomplish the "group by" operation using a priority queue, which
        // tracks the next key for each of our input maps. At each step, our
        // algorithm takes the next subset of maps that share the same next key,
        // runs roaring_bitmap_or_many on those bitmaps, and then advances the
        // current_iter on all the affected entries and then repeats.

        // There is an entry in our priority queue for each of the 'n' inputs.
        // For a given Roaring64Map, we look at its underlying 'roarings'
        // std::map, and take its begin() and end(). This forms our half-open
        // interval [current_iter, end_iter), which we keep in the priority
        // queue as a pq_entry. These entries are updated (removed and then
        // reinserted with the pq_entry.iterator field advanced by one step) as
        // our algorithm progresses. But when a given interval becomes empty
        // (i.e. pq_entry.iterator == pq_entry.end) it is not returned to the
        // priority queue.
        struct pq_entry {
            roarings_t::const_iterator iterator;
            roarings_t::const_iterator end;
        };

        // Custom comparator for the priority queue.
        auto pq_comp = [](const pq_entry &lhs, const pq_entry &rhs) {
            auto left_key = lhs.iterator->first;
            auto right_key = rhs.iterator->first;

            // We compare in the opposite direction than normal because priority
            // queues normally order from largest to smallest, but we want
            // smallest to largest.
            return left_key > right_key;
        };

        // Create and populate the priority queue.
        std::priority_queue<pq_entry, std::vector<pq_entry>, decltype(pq_comp)>
            pq(pq_comp);
        for (size_t i = 0; i < n; ++i) {
            const auto &roarings = inputs[i]->roarings;
            if (roarings.begin() != roarings.end()) {
                pq.push({roarings.begin(), roarings.end()});
            }
        }

        // A reusable vector that holds the pointers to the inner bitmaps that
        // we pass to the underlying 32-bit fastunion operation.
        std::vector<const roaring_bitmap_t *> group_bitmaps;

        // Summary of the algorithm:
        // 1. While the priority queue is not empty:
        //    A. Get its lowest key. Call this group_key
        //    B. While the lowest entry in the priority queue has a key equal to
        //       group_key:
        //       1. Remove this entry (the pair {current_iter, end_iter}) from
        //          the priority queue.
        //       2. Add the bitmap pointed to by current_iter to a list of
        //          32-bit bitmaps to process.
        //       3. Advance current_iter. Now it will point to a bitmap entry
        //          with some key greater than group_key (or it will point to
        //          end()).
        //       4. If current_iter != end_iter, reinsert the pair into the
        //          priority queue.
        //    C. Invoke the 32-bit roaring_bitmap_or_many() and add to result
        Roaring64Map result;
        while (!pq.empty()) {
            // Find the next key (the lowest key) in the priority queue.
            auto group_key = pq.top().iterator->first;

            // The purpose of the inner loop is to gather all the inner bitmaps
            // that share "group_key" into "group_bitmaps" so that they can be
            // fed to roaring_bitmap_or_many(). While we are doing this, we
            // advance those iterators to their next value and reinsert them
            // into the priority queue (unless they reach their end).
            group_bitmaps.clear();
            while (!pq.empty()) {
                auto candidate_current_iter = pq.top().iterator;
                auto candidate_end_iter = pq.top().end;

                auto candidate_key = candidate_current_iter->first;
                const auto &candidate_bitmap = candidate_current_iter->second;

                // This element will either be in the group (having
                // key == group_key) or it will not be in the group (having
                // key > group_key). (Note it cannot have key < group_key
                // because of the ordered nature of the priority queue itself
                // and the ordered nature of all the underlying roaring maps).
                if (candidate_key != group_key) {
                    // This entry, and (thanks to the nature of the priority
                    // queue) all other entries as well, are all greater than
                    // group_key, so we're done collecting elements for the
                    // current group. Because of the way this loop was written,
                    // the group will will always contain at least one element.
                    break;
                }

                group_bitmaps.push_back(&candidate_bitmap.roaring);
                // Remove this entry from the priority queue. Note this
                // invalidates pq.top() so make sure you don't have any dangling
                // references to it.
                pq.pop();

                // Advance 'candidate_current_iter' and insert a new entry
                // {candidate_current_iter, candidate_end_iter} into the
                // priority queue (unless it has reached its end).
                ++candidate_current_iter;
                if (candidate_current_iter != candidate_end_iter) {
                    pq.push({candidate_current_iter, candidate_end_iter});
                }
            }

            // Use the fast inner union to combine these.
            auto *inner_result = roaring_bitmap_or_many(group_bitmaps.size(),
                                                        group_bitmaps.data());
            // Insert the 32-bit result at end of the 'roarings' map of the
            // result we are building.
            result.roarings.insert(
                result.roarings.end(),
                std::make_pair(group_key, Roaring(inner_result)));
        }
        return result;
    }